

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::AddUniversalInstallRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmTarget *this_00;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  cmMakefile *this_01;
  cmValue rhs;
  string *psVar5;
  ostream *poVar6;
  Indent IVar7;
  string local_98;
  string *local_78;
  string local_70;
  string local_50;
  
  local_78 = toDestDirPath;
  this_01 = cmTarget::GetMakefile(this->Target->Target);
  bVar2 = cmMakefile::PlatformIsAppleEmbedded(this_01);
  bVar3 = true;
  if (bVar2) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"XCODE","");
    bVar3 = cmMakefile::IsOn(this_01,&local_50);
    bVar3 = !bVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (!bVar3) {
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"XCODE_VERSION","");
    rhs = cmMakefile::GetDefinition(this_01,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (rhs.Value == (string *)0x0) {
      bVar3 = true;
    }
    else {
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"6","");
      bVar3 = cmSystemTools::VersionCompareGreater(&local_98,rhs.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    if ((bVar3 == false) &&
       (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 < OBJECT_LIBRARY)) {
      this_00 = this->Target->Target;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"IOS_INSTALL_COMBINED","")
      ;
      bVar3 = cmTarget::GetPropertyAsBool(this_00,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        IVar7.Level = indent.Level;
        if (indent.Level < 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,"include(CMakeIOSInstallCombined)\n",0x21);
        }
        else {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar7.Level = IVar7.Level + -1;
          } while (IVar7.Level != 0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,"include(CMakeIOSInstallCombined)\n",0x21);
          if (0 < indent.Level) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              indent.Level = indent.Level + -1;
            } while (indent.Level != 0);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"ios_install_combined(",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        psVar5 = cmTarget::GetName_abi_cxx11_(this->Target->Target);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(local_78->_M_dataplus)._M_p,local_78->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddUniversalInstallRule(
  std::ostream& os, Indent indent, const std::string& toDestDirPath)
{
  cmMakefile const* mf = this->Target->Target->GetMakefile();

  if (!mf->PlatformIsAppleEmbedded() || !mf->IsOn("XCODE")) {
    return;
  }

  cmValue xcodeVersion = mf->GetDefinition("XCODE_VERSION");
  if (!xcodeVersion ||
      cmSystemTools::VersionCompareGreater("6", *xcodeVersion)) {
    return;
  }

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;

    default:
      return;
  }

  if (!this->Target->Target->GetPropertyAsBool("IOS_INSTALL_COMBINED")) {
    return;
  }

  os << indent << "include(CMakeIOSInstallCombined)\n";
  os << indent << "ios_install_combined("
     << "\"" << this->Target->Target->GetName() << "\" "
     << "\"" << toDestDirPath << "\")\n";
}